

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.h
# Opt level: O2

void __thiscall
ktx::PrintIndent::operator()
          (PrintIndent *this,int depth,char (*fmt) [5],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  v10 *this_00;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  int *in_R9;
  format_string<const_char_(&)[1],_int> fmt_00;
  format_string<std::__cxx11::basic_string<char>_> fmt_01;
  int local_1c;
  
  local_1c = (depth + this->indentBase) * this->indentWidth;
  args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xffffffffffffffe4;
  fmt_00.str_.size_ = (size_t)"";
  fmt_00.str_.data_ = (char *)0x5;
  ::fmt::v10::print<char_const(&)[1],int>
            ((v10 *)this->os,(ostream *)"{:{}}",fmt_00,(char (*) [1])args_00,in_R9);
  this_00 = (v10 *)this->os;
  pcVar1 = (char *)strlen(*fmt);
  fmt_01.str_.size_ = (size_t)args;
  fmt_01.str_.data_ = pcVar1;
  ::fmt::v10::print<std::__cxx11::string>(this_00,(ostream *)fmt,fmt_01,args_00);
  return;
}

Assistant:

inline void operator()(int depth, Fmt&& fmt, Args&&... args) {
        fmt::print(os, "{:{}}", "", indentWidth * (indentBase + depth));
        fmt::print(os, std::forward<Fmt>(fmt), std::forward<Args>(args)...);
    }